

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::Loop::GetInductionStepOperation(Loop *this,Instruction *induction)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  uint32_t id;
  uint32_t uVar4;
  DefUseManager *this_00;
  CFG *this_01;
  BasicBlock *bb;
  Instruction *pIVar5;
  uint32_t rhs;
  uint32_t lhs;
  BasicBlock *incoming_block;
  uint32_t operand_id;
  DefUseManager *def_use_manager;
  Instruction *step;
  Instruction *induction_local;
  Loop *this_local;
  
  OVar2 = opt::Instruction::opcode(induction);
  if (OVar2 != OpPhi) {
    __assert_fail("induction->opcode() == spv::Op::OpPhi",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,0x27,
                  "Instruction *spvtools::opt::Loop::GetInductionStepOperation(const Instruction *) const"
                 );
  }
  def_use_manager = (DefUseManager *)0x0;
  this_00 = IRContext::get_def_use_mgr(this->context_);
  incoming_block._4_4_ = 1;
  do {
    uVar3 = opt::Instruction::NumInOperands(induction);
    if (uVar3 <= incoming_block._4_4_) {
LAB_00a2ef66:
      if (def_use_manager != (DefUseManager *)0x0) {
        OVar2 = opt::Instruction::opcode((Instruction *)def_use_manager);
        bVar1 = IsSupportedStepOp(this,OVar2);
        if (bVar1) {
          uVar3 = opt::Instruction::GetSingleWordInOperand((Instruction *)def_use_manager,0);
          id = opt::Instruction::GetSingleWordInOperand((Instruction *)def_use_manager,1);
          uVar4 = opt::Instruction::result_id(induction);
          if ((uVar3 != uVar4) && (uVar4 = opt::Instruction::result_id(induction), id != uVar4)) {
            return (Instruction *)0x0;
          }
          pIVar5 = analysis::DefUseManager::GetDef(this_00,uVar3);
          OVar2 = opt::Instruction::opcode(pIVar5);
          if (OVar2 != OpConstant) {
            pIVar5 = analysis::DefUseManager::GetDef(this_00,id);
            OVar2 = opt::Instruction::opcode(pIVar5);
            if (OVar2 != OpConstant) {
              return (Instruction *)0x0;
            }
          }
          return (Instruction *)def_use_manager;
        }
      }
      return (Instruction *)0x0;
    }
    this_01 = IRContext::cfg(this->context_);
    uVar3 = opt::Instruction::GetSingleWordInOperand(induction,incoming_block._4_4_);
    bb = CFG::block(this_01,uVar3);
    bVar1 = IsInsideLoop(this,bb);
    if (bVar1) {
      uVar3 = opt::Instruction::GetSingleWordInOperand(induction,incoming_block._4_4_ - 1);
      def_use_manager = (DefUseManager *)analysis::DefUseManager::GetDef(this_00,uVar3);
      goto LAB_00a2ef66;
    }
    incoming_block._4_4_ = incoming_block._4_4_ + 2;
  } while( true );
}

Assistant:

Instruction* Loop::GetInductionStepOperation(
    const Instruction* induction) const {
  // Induction must be a phi instruction.
  assert(induction->opcode() == spv::Op::OpPhi);

  Instruction* step = nullptr;

  analysis::DefUseManager* def_use_manager = context_->get_def_use_mgr();

  // Traverse the incoming operands of the phi instruction.
  for (uint32_t operand_id = 1; operand_id < induction->NumInOperands();
       operand_id += 2) {
    // Incoming edge.
    BasicBlock* incoming_block =
        context_->cfg()->block(induction->GetSingleWordInOperand(operand_id));

    // Check if the block is dominated by header, and thus coming from within
    // the loop.
    if (IsInsideLoop(incoming_block)) {
      step = def_use_manager->GetDef(
          induction->GetSingleWordInOperand(operand_id - 1));
      break;
    }
  }

  if (!step || !IsSupportedStepOp(step->opcode())) {
    return nullptr;
  }

  // The induction variable which binds the loop must only be modified once.
  uint32_t lhs = step->GetSingleWordInOperand(0);
  uint32_t rhs = step->GetSingleWordInOperand(1);

  // One of the left hand side or right hand side of the step instruction must
  // be the induction phi and the other must be an OpConstant.
  if (lhs != induction->result_id() && rhs != induction->result_id()) {
    return nullptr;
  }

  if (def_use_manager->GetDef(lhs)->opcode() != spv::Op::OpConstant &&
      def_use_manager->GetDef(rhs)->opcode() != spv::Op::OpConstant) {
    return nullptr;
  }

  return step;
}